

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationAngle.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationAngle::Update
          (ChLinkMotorRotationAngle *this,double mytime,bool update_assets)

{
  long lVar1;
  ChFrame<double> *Fb;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *pgVar6;
  DstXprType **ppDVar7;
  Index index;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  Index size;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ChMatrix33<double> Jw2;
  ChMatrix33<double> Jw1;
  ChQuaternion<double> q;
  ChMatrix33<double> mtempQ;
  ChMatrix33<double> abs_plane_rotating;
  ChFrame<double> aframe1;
  ChFrame<double> aframe2;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *local_478;
  ChMatrix33<double> *local_470;
  ulong local_468;
  ChMatrix33<double> local_458;
  DstXprType local_408;
  ChFrame<double> local_3c0;
  ChMatrix33<double> local_338;
  ChQuaternion<double> local_2e8;
  double dStack_2c8;
  double dStack_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double local_2a8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_298;
  DstEvaluatorType *local_278;
  ulong local_270;
  ulong uStack_268;
  undefined8 local_260;
  DstEvaluatorType *local_258;
  ChFrame<double> local_250;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  ChLinkMotorRotation::Update(&this->super_ChLinkMotorRotation,mytime,update_assets);
  Fb = (ChFrame<double> *)
       (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
       super_ChLink.Body1;
  if (Fb == (ChFrame<double> *)0x0) {
    return;
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
      super_ChLink.Body2 == (ChBodyFrame *)0x0) {
    return;
  }
  ChFrame<double>::operator>>
            (&local_140,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame1,Fb)
  ;
  ChFrame<double>::operator>>
            (&local_b8,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  local_250._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_250.coord.pos.m_data[0] = 0.0;
  local_250.coord.pos.m_data[1] = 0.0;
  local_250.coord.pos.m_data[2] = 0.0;
  local_1c8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_1c8.coord.pos.m_data[0] = 0.0;
  local_1c8.coord.pos.m_data[1] = 0.0;
  local_1c8.coord.pos.m_data[2] = 0.0;
  local_1c8.coord.rot.m_data[0] = 1.0;
  local_1c8.coord.rot.m_data[1] = 0.0;
  local_1c8.coord.rot.m_data[2] = 0.0;
  local_1c8.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_1c8.Amatrix,(ChQuaternion<double> *)&local_250);
  ChFrame<double>::TransformParentToLocal(&local_b8,&local_140,&local_1c8);
  local_250._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_250.coord.pos.m_data[2] = 0.0;
  local_250.coord.pos.m_data[0] = 0.0;
  local_250.coord.pos.m_data[1] = 0.0;
  local_250.coord.rot.m_data[0] = 1.0;
  local_3c0._0_16_ = ZEXT816(0x3ff0000000000000);
  local_3c0._0_32_ = ZEXT1632((undefined1  [16])local_3c0._0_16_);
  local_250.coord.rot.m_data[1] = 0.0;
  local_250.coord.rot.m_data[2] = 0.0;
  local_250.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_250.Amatrix,(ChQuaternion<double> *)&local_3c0);
  (*((this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
     super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction[4]
  )();
  Q_from_AngAxis(&local_2e8,mytime + *(double *)&(this->super_ChLinkMotorRotation).field_0x278,
                 (ChVector<double> *)&VECT_Z);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_b8.coord.rot.m_data[1];
  auVar4._8_8_ = local_2e8.m_data[1];
  auVar4._0_8_ = local_2e8.m_data[0];
  auVar4._16_8_ = local_2e8.m_data[2];
  auVar4._24_8_ = local_2e8.m_data[3];
  auVar19._24_8_ = local_b8.coord.rot.m_data[3];
  auVar19._16_8_ = local_b8.coord.rot.m_data[2];
  auVar24._24_8_ = local_2e8.m_data[1];
  auVar24._16_8_ = local_2e8.m_data[1];
  auVar20._0_8_ = -local_b8.coord.rot.m_data[1];
  auVar20._8_8_ = 0x8000000000000000;
  auVar2 = vpermpd_avx2(auVar4,1);
  auVar22._0_8_ = -local_b8.coord.rot.m_data[2];
  auVar22._8_8_ = -local_b8.coord.rot.m_data[3];
  auVar3 = vpermpd_avx2(ZEXT1632(CONCAT88(local_2e8.m_data[3],local_2e8.m_data[2])),0x15);
  auVar16 = vunpcklpd_avx(auVar20,auVar18);
  auVar21._16_16_ = auVar20;
  auVar21._0_16_ = auVar22;
  auVar19._0_16_ = auVar16;
  auVar17._0_8_ = auVar2._0_8_ * auVar16._0_8_;
  auVar17._8_8_ = auVar2._8_8_ * auVar16._8_8_;
  auVar17._16_8_ = auVar2._16_8_ * local_b8.coord.rot.m_data[2];
  auVar17._24_8_ = auVar2._24_8_ * local_b8.coord.rot.m_data[3];
  auVar2._8_8_ = local_b8.coord.rot.m_data[0];
  auVar2._0_8_ = local_b8.coord.rot.m_data[0];
  auVar2._16_8_ = local_b8.coord.rot.m_data[0];
  auVar2._24_8_ = local_b8.coord.rot.m_data[0];
  auVar17 = vfmadd231pd_avx512vl(auVar17,auVar4,auVar2);
  auVar23._24_8_ = local_b8.coord.rot.m_data[3];
  auVar23._16_8_ = local_b8.coord.rot.m_data[3];
  auVar24._8_8_ = local_2e8.m_data[2];
  auVar24._0_8_ = local_2e8.m_data[2];
  auVar2 = vpermpd_avx2(auVar19,0x66);
  auVar2 = vshufpd_avx(auVar21,auVar2,9);
  auVar23._0_16_ = auVar22;
  auVar4 = vpermpd_avx2(auVar23,0x24);
  auVar16 = vfmadd213pd_fma(auVar24,auVar4,auVar17);
  auVar16 = vfmadd213pd_fma(auVar2,auVar3,ZEXT1632(auVar16));
  local_3c0._0_32_ = ZEXT1632(auVar16);
  ChFrame<double>::SetRot(&local_250,(ChQuaternion<double> *)&local_3c0);
  local_2e8.m_data[0] = 1.0;
  local_3c0._0_16_ = ZEXT816(0xb03780);
  local_3c0._0_32_ = ZEXT1632((undefined1  [16])local_3c0._0_16_);
  local_3c0.coord.rot.m_data[0] = 1.0;
  local_2e8.m_data[1] = 0.0;
  local_2e8.m_data[2] = 0.0;
  local_2e8.m_data[3] = 0.0;
  local_3c0.coord.rot.m_data[1] = 0.0;
  local_3c0.coord.rot.m_data[2] = 0.0;
  local_3c0.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)((long)&local_3c0 + 0x40),&local_2e8);
  ChFrame<double>::TransformParentToLocal(&local_250,&local_140,&local_3c0);
  local_298.m_dst = (DstEvaluatorType *)&local_338;
  local_298.m_functor = (assign_op<double,_double> *)&local_478;
  local_2a8 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
  ;
  local_2e8.m_data[0] =
       local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_2e8.m_data[1] =
       local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_2e8.m_data[2] =
       local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_2e8.m_data[3] =
       local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dStack_2c8 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  dStack_2c0 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  dStack_2b8 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
  dStack_2b0 = local_250.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                  super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
                super_ChFrame<double>.Amatrix;
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_2e8;
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_2e8;
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_408;
  local_298.m_src = (SrcEvaluatorType *)&local_458;
  local_298.m_dstExpr = &local_408;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_298);
  local_298.m_functor =
       (assign_op<double,_double> *)
       &(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
          super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
        Amatrix;
  local_298.m_dst = (DstEvaluatorType *)&local_2e8;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_458,
             (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_298);
  auVar5._8_8_ = local_3c0.coord.rot.m_data[2];
  auVar5._0_8_ = local_3c0.coord.rot.m_data[1];
  local_298.m_dstExpr = (DstXprType *)(local_3c0.coord.rot.m_data[3] * 0.5);
  auVar16._8_8_ = 0x3fe0000000000000;
  auVar16._0_8_ = 0x3fe0000000000000;
  auVar16 = vmulpd_avx512vl(auVar5,auVar16);
  local_298.m_dst = (DstEvaluatorType *)(local_3c0.coord.rot.m_data[0] * 0.5);
  local_298.m_src = (SrcEvaluatorType *)-(double)local_298.m_dstExpr;
  local_298.m_functor = auVar16._8_8_;
  local_270 = auVar16._0_8_ ^ 0x8000000000000000;
  uStack_268 = (ulong)local_298.m_functor ^ 0x8000000000000000;
  local_260 = vmovlpd_avx(auVar16);
  local_478 = &local_298;
  local_470 = (ChMatrix33<double> *)&local_408;
  local_278 = local_298.m_dst;
  local_258 = local_298.m_dst;
  ChMatrix33<double>::operator=
            (&local_338,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_478);
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_478 = &local_298;
  local_470 = &local_458;
  ChMatrix33<double>::operator=
            (&local_338,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_478);
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  uVar13 = (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_z +
           (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_y +
           (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_x;
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rx == true) {
    uVar9 = (ulong)(uVar13 & 0xff);
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
        (long)uVar9) goto LAB_005b51cb;
    (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar9] =
         local_3c0.coord.rot.m_data[1];
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar13) goto LAB_005b516b;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
    uVar8 = local_468;
    pgVar6 = local_478;
    if ((long)local_468 < 0) goto LAB_005b518d;
    uVar11 = local_468;
    if ((((ulong)local_478 & 7) == 0) &&
       (uVar11 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar11)) {
      uVar11 = local_468;
    }
    uVar15 = local_468 - uVar11;
    uVar14 = uVar15 + 7;
    if (-1 < (long)uVar15) {
      uVar14 = uVar15;
    }
    if (uVar11 != 0) {
      memset(local_478,0,uVar11 * 8);
    }
    lVar1 = (uVar14 & 0xfffffffffffffff8) + uVar11;
    if (7 < (long)uVar15) {
      lVar12 = uVar11 + 8;
      if ((long)(uVar11 + 8) < lVar1) {
        lVar12 = lVar1;
      }
      memset(&pgVar6->m_dst + uVar11,0,(~uVar11 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar1 < (long)uVar8) {
      memset(&pgVar6[((long)uVar14 >> 3) * 2].m_dst + uVar11,0,((long)uVar15 % 8) * 8);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar13) goto LAB_005b516b;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
    uVar8 = local_468;
    pgVar6 = local_478;
    if ((long)local_468 < 0) goto LAB_005b518d;
    uVar11 = local_468;
    if ((((ulong)local_478 & 7) == 0) &&
       (uVar11 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar11)) {
      uVar11 = local_468;
    }
    uVar15 = local_468 - uVar11;
    uVar14 = uVar15 + 7;
    if (-1 < (long)uVar15) {
      uVar14 = uVar15;
    }
    if (uVar11 != 0) {
      memset(local_478,0,uVar11 * 8);
    }
    lVar1 = (uVar14 & 0xfffffffffffffff8) + uVar11;
    if (7 < (long)uVar15) {
      lVar12 = uVar11 + 8;
      if ((long)(uVar11 + 8) < lVar1) {
        lVar12 = lVar1;
      }
      memset(&pgVar6->m_dst + uVar11,0,(~uVar11 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar1 < (long)uVar8) {
      memset(&pgVar6[((long)uVar14 >> 3) * 2].m_dst + uVar11,0,((long)uVar15 % 8) * 8);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar13) goto LAB_005b516b;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
    if ((long)local_468 < 6) goto LAB_005b51ac;
    uVar8 = 3;
    ppDVar7 = &local_478->m_dstExpr;
    if (((ulong)ppDVar7 & 7) == 0) {
      uVar10 = -((uint)((ulong)ppDVar7 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar10 < 3) {
        uVar8 = (ulong)uVar10;
      }
      if (uVar10 != 0) goto LAB_005b49e7;
    }
    else {
LAB_005b49e7:
      uVar11 = 0;
      do {
        ppDVar7[uVar11] =
             (DstXprType *)
             local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
    }
    if (uVar8 < 3) {
      do {
        ppDVar7[uVar8] =
             (DstXprType *)
             local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != 3);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar13) goto LAB_005b516b;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
    if ((long)local_468 < 6) goto LAB_005b51ac;
    uVar9 = 3;
    ppDVar7 = &local_478->m_dstExpr;
    if (((ulong)ppDVar7 & 7) == 0) {
      uVar10 = -((uint)((ulong)ppDVar7 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar10 < 3) {
        uVar9 = (ulong)uVar10;
      }
      if (uVar10 != 0) goto LAB_005b4a77;
    }
    else {
LAB_005b4a77:
      uVar8 = 0;
      do {
        ppDVar7[uVar8] =
             (DstXprType *)
             local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    if (uVar9 < 3) {
      do {
        ppDVar7[uVar9] =
             (DstXprType *)
             local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar9 != 3);
    }
    uVar13 = uVar13 + 1;
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_ry == true) {
    uVar9 = (ulong)uVar13;
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
        (long)uVar9) goto LAB_005b51cb;
    (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar9] =
         local_3c0.coord.rot.m_data[2];
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar13) goto LAB_005b516b;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
    uVar8 = local_468;
    pgVar6 = local_478;
    if ((long)local_468 < 0) goto LAB_005b518d;
    uVar11 = local_468;
    if ((((ulong)local_478 & 7) == 0) &&
       (uVar11 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar11)) {
      uVar11 = local_468;
    }
    uVar15 = local_468 - uVar11;
    uVar14 = uVar15 + 7;
    if (-1 < (long)uVar15) {
      uVar14 = uVar15;
    }
    if (uVar11 != 0) {
      memset(local_478,0,uVar11 * 8);
    }
    lVar1 = (uVar14 & 0xfffffffffffffff8) + uVar11;
    if (7 < (long)uVar15) {
      lVar12 = uVar11 + 8;
      if ((long)(uVar11 + 8) < lVar1) {
        lVar12 = lVar1;
      }
      memset(&pgVar6->m_dst + uVar11,0,(~uVar11 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar1 < (long)uVar8) {
      memset(&pgVar6[((long)uVar14 >> 3) * 2].m_dst + uVar11,0,((long)uVar15 % 8) * 8);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar13) goto LAB_005b516b;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
    uVar8 = local_468;
    pgVar6 = local_478;
    if ((long)local_468 < 0) goto LAB_005b518d;
    uVar11 = local_468;
    if ((((ulong)local_478 & 7) == 0) &&
       (uVar11 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar11)) {
      uVar11 = local_468;
    }
    uVar15 = local_468 - uVar11;
    uVar14 = uVar15 + 7;
    if (-1 < (long)uVar15) {
      uVar14 = uVar15;
    }
    if (uVar11 != 0) {
      memset(local_478,0,uVar11 * 8);
    }
    lVar1 = (uVar14 & 0xfffffffffffffff8) + uVar11;
    if (7 < (long)uVar15) {
      lVar12 = uVar11 + 8;
      if ((long)(uVar11 + 8) < lVar1) {
        lVar12 = lVar1;
      }
      memset(&pgVar6->m_dst + uVar11,0,(~uVar11 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
    }
    if (lVar1 < (long)uVar8) {
      memset(&pgVar6[((long)uVar14 >> 3) * 2].m_dst + uVar11,0,((long)uVar15 % 8) * 8);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar13) goto LAB_005b516b;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
    if ((long)local_468 < 6) goto LAB_005b51ac;
    uVar8 = 3;
    ppDVar7 = &local_478->m_dstExpr;
    if (((ulong)ppDVar7 & 7) == 0) {
      uVar10 = -((uint)((ulong)ppDVar7 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar10 < 3) {
        uVar8 = (ulong)uVar10;
      }
      if (uVar10 != 0) goto LAB_005b4d3f;
    }
    else {
LAB_005b4d3f:
      uVar11 = 0;
      do {
        ppDVar7[uVar11] =
             (DstXprType *)
             local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar11 + 3];
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
    }
    if (uVar8 < 3) {
      do {
        ppDVar7[uVar8] =
             (DstXprType *)
             local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar8 + 3];
        uVar8 = uVar8 + 1;
      } while (uVar8 != 3);
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
        (int)uVar13) goto LAB_005b516b;
    (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                        mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
    if ((long)local_468 < 6) goto LAB_005b51ac;
    uVar9 = 3;
    ppDVar7 = &local_478->m_dstExpr;
    if (((ulong)ppDVar7 & 7) == 0) {
      uVar10 = -((uint)((ulong)ppDVar7 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar10 < 3) {
        uVar9 = (ulong)uVar10;
      }
      if (uVar10 != 0) goto LAB_005b4dcf;
    }
    else {
LAB_005b4dcf:
      uVar8 = 0;
      do {
        ppDVar7[uVar8] =
             (DstXprType *)
             local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar8 + 3];
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    if (uVar9 < 3) {
      do {
        ppDVar7[uVar9] =
             (DstXprType *)
             local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar9 + 3];
        uVar9 = uVar9 + 1;
      } while (uVar9 != 3);
    }
    uVar13 = uVar13 + 1;
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rz != true) {
    return;
  }
  uVar9 = (ulong)uVar13;
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <= (long)uVar9)
  {
LAB_005b51cb:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
                 );
  }
  (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.C.
  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_data.array[uVar9] =
       local_3c0.coord.rot.m_data[3];
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
      (int)uVar13) goto LAB_005b516b;
  (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                      mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
  uVar8 = local_468;
  pgVar6 = local_478;
  if ((long)local_468 < 0) {
LAB_005b518d:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, 1, -1>]"
                 );
  }
  uVar11 = local_468;
  if ((((ulong)local_478 & 7) == 0) &&
     (uVar11 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar11)) {
    uVar11 = local_468;
  }
  uVar15 = local_468 - uVar11;
  uVar14 = uVar15 + 7;
  if (-1 < (long)uVar15) {
    uVar14 = uVar15;
  }
  if (uVar11 != 0) {
    memset(local_478,0,uVar11 * 8);
  }
  lVar1 = (uVar14 & 0xfffffffffffffff8) + uVar11;
  if (7 < (long)uVar15) {
    lVar12 = uVar11 + 8;
    if ((long)(uVar11 + 8) < lVar1) {
      lVar12 = lVar1;
    }
    memset(&pgVar6->m_dst + uVar11,0,(~uVar11 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar1 < (long)uVar8) {
    memset(&pgVar6[((long)uVar14 >> 3) * 2].m_dst + uVar11,0,((long)uVar15 % 8) * 8);
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
      (int)uVar13) goto LAB_005b516b;
  (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                      mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
  uVar8 = local_468;
  pgVar6 = local_478;
  if ((long)local_468 < 0) goto LAB_005b518d;
  uVar11 = local_468;
  if ((((ulong)local_478 & 7) == 0) &&
     (uVar11 = (ulong)(-((uint)((ulong)local_478 >> 3) & 0x1fffffff) & 7), local_468 <= uVar11)) {
    uVar11 = local_468;
  }
  uVar15 = local_468 - uVar11;
  uVar14 = uVar15 + 7;
  if (-1 < (long)uVar15) {
    uVar14 = uVar15;
  }
  if (uVar11 != 0) {
    memset(local_478,0,uVar11 * 8);
  }
  lVar1 = (uVar14 & 0xfffffffffffffff8) + uVar11;
  if (7 < (long)uVar15) {
    lVar12 = uVar11 + 8;
    if ((long)(uVar11 + 8) < lVar1) {
      lVar12 = lVar1;
    }
    memset(&pgVar6->m_dst + uVar11,0,(~uVar11 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar1 < (long)uVar8) {
    memset(&pgVar6[((long)uVar14 >> 3) * 2].m_dst + uVar11,0,((long)uVar15 % 8) * 8);
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
      (int)uVar13) goto LAB_005b516b;
  (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                      mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x88))(&local_478);
  if ((long)local_468 < 6) goto LAB_005b51ac;
  uVar8 = 3;
  ppDVar7 = &local_478->m_dstExpr;
  if (((ulong)ppDVar7 & 7) == 0) {
    uVar10 = -((uint)((ulong)ppDVar7 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar8 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_005b5097;
  }
  else {
LAB_005b5097:
    uVar11 = 0;
    do {
      ppDVar7[uVar11] =
           (DstXprType *)
           local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar11 + 6];
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
  }
  if (uVar8 < 3) {
    do {
      ppDVar7[uVar8] =
           (DstXprType *)
           local_408.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar8 + 6];
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr <=
      (int)uVar13) {
LAB_005b516b:
    __assert_fail("(i >= 0) && (i < nconstr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                  ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
  }
  (**(code **)((long)((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                      mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x90))(&local_478);
  if ((long)local_468 < 6) {
LAB_005b51ac:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  uVar9 = 3;
  ppDVar7 = &local_478->m_dstExpr;
  if (((ulong)ppDVar7 & 7) == 0) {
    uVar13 = -((uint)((ulong)ppDVar7 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar13 < 3) {
      uVar9 = (ulong)uVar13;
    }
    if (uVar13 == 0) goto LAB_005b513c;
  }
  uVar8 = 0;
  do {
    ppDVar7[uVar8] =
         (DstXprType *)
         local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         [uVar8 + 6];
    uVar8 = uVar8 + 1;
  } while (uVar9 != uVar8);
LAB_005b513c:
  if (uVar9 < 3) {
    do {
      ppDVar7[uVar9] =
           (DstXprType *)
           local_458.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
           [uVar9 + 6];
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  return;
}

Assistant:

void ChLinkMotorRotationAngle::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorRotation::Update(mytime, update_assets);

    // Override the rotational jacobian [Cq] and the rotational residual C,
    // by assuming an additional hidden frame that rotates about frame2:

    if (this->Body1 && this->Body2) {
        ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
        ChFrame<> aframe2 = this->frame2 >> (*this->Body2);

        ChFrame<> aframe12;
        aframe2.TransformParentToLocal(aframe1, aframe12);

        ChFrame<> aframe2rotating;

        double aux_rotation;

        aux_rotation = m_func->Get_y(mytime) + rot_offset;

        aframe2rotating.SetRot(aframe2.GetRot() * Q_from_AngAxis(aux_rotation, VECT_Z));

        ChFrame<> aframe12rotating;
        aframe2rotating.TransformParentToLocal(aframe1, aframe12rotating);

        ChMatrix33<> abs_plane_rotating = aframe2rotating.GetA();

        ChMatrix33<> Jw1 = abs_plane_rotating.transpose() * Body1->GetA();
        ChMatrix33<> Jw2 = -abs_plane_rotating.transpose() * Body2->GetA();

        // Premultiply by Jw1 and Jw2 by  0.5*[Fp(q_resid)]' to get residual as imaginary part of a quaternion.
        ChStarMatrix33<> mtempM(aframe12rotating.GetRot().GetVector() * 0.5);
        mtempM(0, 0) = 0.5 * aframe12rotating.GetRot().e0();
        mtempM(1, 1) = 0.5 * aframe12rotating.GetRot().e0();
        mtempM(2, 2) = 0.5 * aframe12rotating.GetRot().e0();

        ChMatrix33<> mtempQ;
        mtempQ = mtempM.transpose() * Jw1;
        Jw1 = mtempQ;
        mtempQ = mtempM.transpose() * Jw2;
        Jw2 = mtempQ;

        int nc = 0;

        if (c_x) {
            nc++;
        }
        if (c_y) {
            nc++;
        }
        if (c_z) {
            nc++;
        }
        if (c_rx) {
            C(nc) = aframe12rotating.GetRot().e1();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(0);
            nc++;
        }
        if (c_ry) {
            C(nc) = aframe12rotating.GetRot().e2();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(1);
            nc++;
        }
        if (c_rz) {
            C(nc) = aframe12rotating.GetRot().e3();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(2);
            nc++;
        }
    }
}